

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintMessageEnd_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,int field_index,
          int field_count,bool single_line_mode)

{
  char *pcVar1;
  undefined3 in_register_00000089;
  StringBaseTextGenerator generator;
  
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__StringBaseTextGenerator_0060e7a0;
  generator.output_._M_dataplus._M_p = (pointer)&generator.output_.field_2;
  generator.output_._M_string_length = 0;
  generator.output_.field_2._M_local_buf[0] = '\0';
  pcVar1 = "$0  }\n";
  if (CONCAT31(in_register_00000089,single_line_mode) != 0) {
    pcVar1 = "} {z} ";
  }
  std::__cxx11::string::append((char *)&generator.output_,(ulong)(pcVar1 + 4));
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&generator.output_);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(&generator);
  return __return_storage_ptr__;
}

Assistant:

void Print(const char* text, size_t size) override {
    output_.append(text, size);
  }